

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

bool __thiscall cmSourceFileLocation::Matches(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  cmMakefile *this_00;
  cmSourceFileLocation *this_01;
  bool bVar1;
  string *psVar2;
  cmSourceFileLocation *loc_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string srcDir;
  string binDir;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0xa4,"bool cmSourceFileLocation::Matches(const cmSourceFileLocation &)");
  }
  if (this->AmbiguousExtension == loc->AmbiguousExtension) {
    if ((this->Name)._M_string_length != (loc->Name)._M_string_length) {
      return false;
    }
    bVar1 = cmsys::SystemTools::ComparePath(&this->Name,&loc->Name);
  }
  else {
    loc_00 = loc;
    this_01 = this;
    if (this->AmbiguousExtension != false) {
      loc_00 = this;
      this_01 = loc;
    }
    bVar1 = MatchesAmbiguousExtension(this_01,loc_00);
  }
  if (bVar1 == false) {
    return false;
  }
  if (this->AmbiguousDirectory == false) {
    if (loc->AmbiguousDirectory != false) {
      psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(loc->Makefile);
      cmsys::SystemTools::CollapseFullPath(&srcDir,&loc->Directory,psVar2);
      psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(loc->Makefile);
      cmsys::SystemTools::CollapseFullPath(&binDir,&loc->Directory,psVar2);
      __rhs = &this->Directory;
      goto LAB_001b2af0;
    }
  }
  else {
    if (loc->AmbiguousDirectory == false) {
      psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&srcDir,&this->Directory,psVar2);
      psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&binDir,&this->Directory,psVar2);
      __rhs = &loc->Directory;
LAB_001b2af0:
      bVar1 = std::operator!=(&srcDir,__rhs);
      if ((bVar1) && (bVar1 = std::operator!=(&binDir,__rhs), bVar1)) {
        std::__cxx11::string::~string((string *)&binDir);
LAB_001b2b1a:
        std::__cxx11::string::~string((string *)&srcDir);
        return false;
      }
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&srcDir);
      goto LAB_001b2b56;
    }
    this_00 = this->Makefile;
    if (this_00 != loc->Makefile) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&srcDir,
                 "Matches error: Each side has a directory relative to a different location. This can occur when referencing a source file from a different directory.  This is not yet allowed."
                 ,(allocator<char> *)&binDir);
      cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,&srcDir);
      goto LAB_001b2b1a;
    }
  }
  bVar1 = std::operator!=(&this->Directory,&loc->Directory);
  if (bVar1) {
    return false;
  }
LAB_001b2b56:
  Update(this,loc);
  return true;
}

Assistant:

bool cmSourceFileLocation::Matches(cmSourceFileLocation const& loc)
{
  assert(this->Makefile);
  if (this->AmbiguousExtension == loc.AmbiguousExtension) {
    // Both extensions are similarly ambiguous.  Since only the old fixed set
    // of extensions will be tried, the names must match at this point to be
    // the same file.
    if (this->Name.size() != loc.Name.size() ||
        !cmSystemTools::ComparePath(this->Name, loc.Name)) {
      return false;
    }
  } else {
    const cmSourceFileLocation* loc1;
    const cmSourceFileLocation* loc2;
    if (this->AmbiguousExtension) {
      // Only "this" extension is ambiguous.
      loc1 = &loc;
      loc2 = this;
    } else {
      // Only "loc" extension is ambiguous.
      loc1 = this;
      loc2 = &loc;
    }
    if (!loc1->MatchesAmbiguousExtension(*loc2)) {
      return false;
    }
  }

  if (!this->AmbiguousDirectory && !loc.AmbiguousDirectory) {
    // Both sides have absolute directories.
    if (this->Directory != loc.Directory) {
      return false;
    }
  } else if (this->AmbiguousDirectory && loc.AmbiguousDirectory) {
    if (this->Makefile == loc.Makefile) {
      // Both sides have directories relative to the same location.
      if (this->Directory != loc.Directory) {
        return false;
      }
    } else {
      // Each side has a directory relative to a different location.
      // This can occur when referencing a source file from a different
      // directory.  This is not yet allowed.
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "Matches error: Each side has a directory relative to a different "
        "location. This can occur when referencing a source file from a "
        "different directory.  This is not yet allowed.");
      return false;
    }
  } else if (this->AmbiguousDirectory) {
    // Compare possible directory combinations.
    std::string const srcDir = cmSystemTools::CollapseFullPath(
      this->Directory, this->Makefile->GetCurrentSourceDirectory());
    std::string const binDir = cmSystemTools::CollapseFullPath(
      this->Directory, this->Makefile->GetCurrentBinaryDirectory());
    if (srcDir != loc.Directory && binDir != loc.Directory) {
      return false;
    }
  } else if (loc.AmbiguousDirectory) {
    // Compare possible directory combinations.
    std::string const srcDir = cmSystemTools::CollapseFullPath(
      loc.Directory, loc.Makefile->GetCurrentSourceDirectory());
    std::string const binDir = cmSystemTools::CollapseFullPath(
      loc.Directory, loc.Makefile->GetCurrentBinaryDirectory());
    if (srcDir != this->Directory && binDir != this->Directory) {
      return false;
    }
  }

  // File locations match.
  this->Update(loc);
  return true;
}